

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O1

void inmateMove(UnitList *inmateList,Path *path)

{
  float fVar1;
  uint uVar2;
  TileNode *pTVar3;
  undefined1 *puVar4;
  UnitNode *pUVar5;
  TileNode *pTVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  
  if (inmateList == (UnitList *)0x0) {
    pUVar5 = (UnitNode *)0x0;
  }
  else {
    pUVar5 = inmateList->head;
  }
  uVar2 = path->count;
  pTVar3 = path->first;
  do {
    pTVar6 = pTVar3;
    if (uVar2 != 0) {
      uVar7 = uVar2;
      do {
        if (pTVar6->location == (int)*(float *)((long)pUVar5->unit + 4)) break;
        pTVar6 = pTVar6->next;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    puVar4 = (undefined1 *)pUVar5->unit;
    fVar1 = *(float *)(puVar4 + 4);
    fVar10 = (float)*(uint *)(puVar4 + 0x10) * 0.125 + fVar1;
    *(float *)(puVar4 + 4) = fVar10;
    iVar9 = (int)fVar10;
    iVar8 = (int)fVar1 + 1;
    if (iVar8 == iVar9) {
      if (pTVar6->next == (TileNode *)0x0) {
        if ((iVar8 == iVar9) && (pTVar6->next == (TileNode *)0x0)) {
          *puVar4 = 1;
        }
      }
      else {
        *(float *)(puVar4 + 4) = (float)pTVar6->next->location;
      }
    }
    pUVar5 = pUVar5->next;
    if ((pUVar5 == (UnitNode *)0x0) || (pUVar5->next == (UnitNode *)0x0)) {
      return;
    }
  } while( true );
}

Assistant:

void inmateMove(struct UnitList *inmateList, struct Path *path) {
    struct UnitNode *nextInmate;
    struct TileNode *nextTile;
    int prevPos;

    nextInmate = getHead(inmateList);
    do {
        nextTile = path->first;
        for (int i = 0; i < path->count; i++) {
            if (nextTile->location ==
                (int) ((struct Inmate *) nextInmate->unit)->position)
                break;
            nextTile = nextTile->next;
        }
        prevPos = ((struct Inmate *) nextInmate->unit)->position;
        ((struct Inmate *) nextInmate->unit)->position =
            ((struct Inmate *) nextInmate->unit)->position +
                (float) ((struct Inmate *) nextInmate->unit)->speed / 8;
        if ((int) ((struct Inmate *) nextInmate->unit)->position ==
            prevPos + 1 && nextTile->next != NULL)
            ((struct Inmate *) nextInmate->unit)->position = nextTile->next->location;
        else if ((int) ((struct Inmate *) nextInmate->unit)->position ==
            prevPos + 1 && nextTile->next == NULL) {
            ((struct Inmate *) nextInmate->unit)->delUnit = TRUE;
            //endwin();
        }
        nextInmate = getNext(nextInmate);
    } while (getNext(nextInmate));
}